

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_readlink(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  void *eval_b_1;
  void *eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_fs_t req;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(::loop,&eval_a,"no_such_file",dummy_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7dc,"0 == uv_fs_readlink(loop, &req, \"no_such_file\", dummy_cb)");
    abort();
  }
  iVar1 = uv_run(::loop,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7dd,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (dummy_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7de,"dummy_cb_count == 1");
    abort();
  }
  if (req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7df,"req.ptr","==","NULL",req.result,"==",0);
    abort();
  }
  if (req.cb != (uv_fs_cb)0xfffffffffffffffe) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7e0,"req.result == UV_ENOENT");
    abort();
  }
  uv_fs_req_cleanup(&eval_a);
  iVar1 = uv_fs_readlink(0,&eval_a,"no_such_file");
  if (iVar1 != -2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7e3,"UV_ENOENT == uv_fs_readlink(NULL, &req, \"no_such_file\", NULL)");
    abort();
  }
  if (req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7e4,"req.ptr","==","NULL",req.result,"==",0);
    abort();
  }
  if (req.cb != (uv_fs_cb)0xfffffffffffffffe) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7e5,"req.result == UV_ENOENT");
    abort();
  }
  uv_fs_req_cleanup(&eval_a);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7e8,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_readlink) {
  uv_fs_t req;

  loop = uv_default_loop();
  ASSERT(0 == uv_fs_readlink(loop, &req, "no_such_file", dummy_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(dummy_cb_count == 1);
  ASSERT_NULL(req.ptr);
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  ASSERT(UV_ENOENT == uv_fs_readlink(NULL, &req, "no_such_file", NULL));
  ASSERT_NULL(req.ptr);
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY();
  return 0;
}